

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::SerializeWithCachedSizes
          (ItemSimilarityRecommender *this,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ItemSimilarityRecommender_SimilarItems *value;
  long lVar4;
  char *pcVar5;
  string *psVar6;
  uint local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ItemSimilarityRecommender *this_local;
  
  local_20 = 0;
  uVar2 = itemitemsimilarities_size(this);
  for (; local_20 < uVar2; local_20 = local_20 + 1) {
    value = itemitemsimilarities(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  bVar1 = has_itemstringids(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->itemstringids_->super_MessageLite,output);
  }
  bVar1 = has_itemint64ids(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->itemint64ids_->super_MessageLite,output);
  }
  iteminputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    iteminputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    iteminputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.itemInputFeatureName");
    psVar6 = iteminputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(10,psVar6,output);
  }
  numrecommendationsinputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    numrecommendationsinputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    numrecommendationsinputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.numRecommendationsInputFeatureName");
    psVar6 = numrecommendationsinputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xb,psVar6,output);
  }
  itemrestrictioninputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    itemrestrictioninputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    itemrestrictioninputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.itemRestrictionInputFeatureName");
    psVar6 = itemrestrictioninputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xc,psVar6,output);
  }
  itemexclusioninputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    itemexclusioninputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    itemexclusioninputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.itemExclusionInputFeatureName");
    psVar6 = itemexclusioninputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xd,psVar6,output);
  }
  recommendeditemlistoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    recommendeditemlistoutputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    recommendeditemlistoutputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.recommendedItemListOutputFeatureName"
              );
    psVar6 = recommendeditemlistoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x14,psVar6,output);
  }
  recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.recommendedItemScoreOutputFeatureName"
              );
    psVar6 = recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x15,psVar6,output);
  }
  return;
}

Assistant:

void ItemSimilarityRecommender::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ItemSimilarityRecommender)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
  for (unsigned int i = 0, n = this->itemitemsimilarities_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->itemitemsimilarities(i), output);
  }

  // .CoreML.Specification.StringVector itemStringIds = 2;
  if (this->has_itemstringids()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->itemstringids_, output);
  }

  // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
  if (this->has_itemint64ids()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->itemint64ids_, output);
  }

  // string itemInputFeatureName = 10;
  if (this->iteminputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->iteminputfeaturename().data(), this->iteminputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.itemInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->iteminputfeaturename(), output);
  }

  // string numRecommendationsInputFeatureName = 11;
  if (this->numrecommendationsinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->numrecommendationsinputfeaturename().data(), this->numrecommendationsinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.numRecommendationsInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      11, this->numrecommendationsinputfeaturename(), output);
  }

  // string itemRestrictionInputFeatureName = 12;
  if (this->itemrestrictioninputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->itemrestrictioninputfeaturename().data(), this->itemrestrictioninputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.itemRestrictionInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->itemrestrictioninputfeaturename(), output);
  }

  // string itemExclusionInputFeatureName = 13;
  if (this->itemexclusioninputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->itemexclusioninputfeaturename().data(), this->itemexclusioninputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.itemExclusionInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      13, this->itemexclusioninputfeaturename(), output);
  }

  // string recommendedItemListOutputFeatureName = 20;
  if (this->recommendeditemlistoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->recommendeditemlistoutputfeaturename().data(), this->recommendeditemlistoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.recommendedItemListOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      20, this->recommendeditemlistoutputfeaturename(), output);
  }

  // string recommendedItemScoreOutputFeatureName = 21;
  if (this->recommendeditemscoreoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->recommendeditemscoreoutputfeaturename().data(), this->recommendeditemscoreoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.recommendedItemScoreOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      21, this->recommendeditemscoreoutputfeaturename(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ItemSimilarityRecommender)
}